

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# repeated_ptr_field.h
# Opt level: O3

bool CoreML::Specification::operator==
               (RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing> *a,
               RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing> *b)

{
  bool bVar1;
  Type *a_00;
  Type *b_00;
  int iVar2;
  
  iVar2 = (a->super_RepeatedPtrFieldBase).current_size_;
  if (iVar2 != (b->super_RepeatedPtrFieldBase).current_size_) {
    return false;
  }
  if (0 < iVar2) {
    iVar2 = 0;
    do {
      a_00 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                       (&a->super_RepeatedPtrFieldBase,iVar2);
      b_00 = google::protobuf::internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<CoreML::Specification::NeuralNetworkPreprocessing>::TypeHandler>
                       (&b->super_RepeatedPtrFieldBase,iVar2);
      bVar1 = operator==(a_00,b_00);
      if (!bVar1) {
        return bVar1;
      }
      iVar2 = iVar2 + 1;
    } while (iVar2 < (a->super_RepeatedPtrFieldBase).current_size_);
    return bVar1;
  }
  return true;
}

Assistant:

inline int RepeatedPtrFieldBase::size() const { return current_size_; }